

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void rw::MatFX::setEffects(Material *mat,uint32 type)

{
  MatFX *local_20;
  MatFX *matfx;
  uint32 type_local;
  Material *mat_local;
  
  local_20 = get(mat);
  if (local_20 == (MatFX *)0x0) {
    local_20 = (MatFX *)mustmalloc_LOC(0x58,0x30120,
                                       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/matfx.cpp line: 107"
                                      );
    memset(local_20,0,0x58);
    *(MatFX **)((long)&mat->texture + (long)DAT_00168b9c) = local_20;
  }
  if ((local_20->type != 0) && (local_20->type != type)) {
    clearMatFX(local_20);
  }
  local_20->type = type;
  if (1 < type - 1) {
    if (type == 3) {
      local_20->fx[0].type = 1;
      local_20->fx[1].type = 2;
      return;
    }
    if (1 < type - 4) {
      if (type != 6) {
        return;
      }
      local_20->fx[0].type = 5;
      local_20->fx[1].type = 4;
      return;
    }
  }
  local_20->fx[0].type = type;
  local_20->fx[1].type = 0;
  return;
}

Assistant:

void
MatFX::setEffects(Material *mat, uint32 type)
{
	MatFX *matfx;

	matfx = MatFX::get(mat);
	if(matfx == nil){
		matfx = rwNewT(MatFX, 1, MEMDUR_EVENT | ID_MATFX);
		memset(matfx, 0, sizeof(MatFX));
		*PLUGINOFFSET(MatFX*, mat, matFXGlobals.materialOffset) = matfx;
	}

	if(matfx->type != 0 && matfx->type != type)
		clearMatFX(matfx);
	matfx->type = type;
	switch(type){
	case BUMPMAP:
	case ENVMAP:
	case DUAL:
	case UVTRANSFORM:
		matfx->fx[0].type = type;
		matfx->fx[1].type = NOTHING;
		break;

	case BUMPENVMAP:
		matfx->fx[0].type = BUMPMAP;
		matfx->fx[1].type = ENVMAP;
		break;

	case DUALUVTRANSFORM:
		matfx->fx[0].type = UVTRANSFORM;
		matfx->fx[1].type = DUAL;
		break;
	}
}